

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor-transfer-function.h
# Opt level: O0

void __thiscall
wasm::analysis::
VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
::collectResults(VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
                 *this,BasicBlock *bb,Element *inputState)

{
  bool bVar1;
  reference ppEVar2;
  __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  local_30;
  __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  local_28;
  iterator it;
  Element *inputState_local;
  BasicBlock *bb_local;
  VisitorTransferFunc<wasm::analysis::ReachingDefinitionsTransferFunction,_wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_(wasm::analysis::AnalysisDirection)0>
  *this_local;
  
  this->collectingResults = true;
  this->currState = inputState;
  it._M_current = (Expression **)inputState;
  local_28._M_current = (Expression **)BasicBlock::begin(bb);
  while( true ) {
    local_30._M_current = (Expression **)BasicBlock::end(bb);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator*(&local_28);
    Visitor<wasm::analysis::ReachingDefinitionsTransferFunction,_void>::visit
              ((Visitor<wasm::analysis::ReachingDefinitionsTransferFunction,_void> *)this,*ppEVar2);
    __gnu_cxx::
    __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::operator++(&local_28);
  }
  this->currState = (Element *)0x0;
  this->collectingResults = false;
  return;
}

Assistant:

void collectResults(const BasicBlock& bb, typename L::Element& inputState) {
    collectingResults = true;
    currState = &inputState;
    if constexpr (Direction == AnalysisDirection::Backward) {
      for (auto it = bb.rbegin(); it != bb.rend(); ++it) {
        static_cast<SubType*>(this)->visit(*it);
      }
    } else {
      for (auto it = bb.begin(); it != bb.end(); ++it) {
        static_cast<SubType*>(this)->visit(*it);
      }
    }
    currState = nullptr;
    collectingResults = false;
  }